

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.c
# Opt level: O3

void __thiscall Sparse_matrix_Append_element(void *this,uint row,uint col,double value)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  
  if (row != col) {
    uVar2 = *(int *)((long)this + 0x1c) + 1;
    *(uint *)((long)this + 0x1c) = uVar2;
    lVar1 = *(long *)((long)this + 8);
    uVar3 = *(uint *)((long)this + 0x18);
    while (uVar3 < row) {
      *(uint *)((long)this + 0x18) = uVar3 + 1;
      *(uint *)(lVar1 + 4 + (ulong)uVar3 * 4) = uVar2;
      uVar3 = *(uint *)((long)this + 0x18);
    }
    *(uint *)(lVar1 + (ulong)uVar2 * 4) = col;
    row = *(uint *)((long)this + 0x1c);
  }
  *(double *)(*(long *)((long)this + 0x10) + (ulong)row * 8) = value;
  return;
}

Assistant:

void Sparse_matrix_Append_element (
    Sparse_matrix * this,
    unsigned row,
    unsigned col,
    double value) {

  if (row == col) {
    this->elements[row] = value;
    return;
  }

  ++(this->filled_element);
  while (this->current_row < row) {
    ++(this->current_row);
    this->indices[this->current_row] = this->filled_element;
  }
  this->indices[this->filled_element] = col;
  this->elements[this->filled_element] = value;
}